

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CoverageBinSymbol::TransRangeList::serializeTo
          (TransRangeList *this,ASTSerializer *serializer)

{
  int iVar1;
  string_view name;
  bool bVar2;
  ASTSerializer *in_RSI;
  long in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  Expression *item;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  Expression *in_stack_fffffffffffffef8;
  ASTSerializer *in_stack_ffffffffffffff00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffff08;
  ASTSerializer *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  ASTSerializer *pAVar4;
  size_t local_c0;
  int local_b0;
  void *local_a8;
  size_t local_a0;
  int local_90;
  void *local_88;
  size_t local_80;
  int local_70;
  void *local_68;
  int local_60;
  void *local_58;
  int local_50;
  void *local_48;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_30 [4];
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff10,
             (char *)in_stack_ffffffffffffff08);
  name._M_len._4_4_ = in_stack_ffffffffffffff1c;
  name._M_len._0_4_ = in_stack_ffffffffffffff18;
  name._M_str = in_stack_ffffffffffffff20;
  ASTSerializer::startArray(in_stack_ffffffffffffff10,name);
  local_30[0]._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_fffffffffffffef8);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            (in_stack_ffffffffffffff08);
  while (bVar2 = __gnu_cxx::
                 operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                           ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff00,
                            (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffef8), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator*(local_30);
    ASTSerializer::serialize(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(local_30);
  }
  ASTSerializer::endArray((ASTSerializer *)0x8c507c);
  pAVar4 = local_10;
  if (*(long *)(in_RDI + 0x10) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff10,
               (char *)in_stack_ffffffffffffff08);
    ASTSerializer::write(pAVar4,local_50,local_48,*(size_t *)(in_RDI + 0x10));
  }
  if (*(long *)(in_RDI + 0x18) != 0) {
    pAVar4 = local_10;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff10,
               (char *)in_stack_ffffffffffffff08);
    ASTSerializer::write(pAVar4,local_60,local_58,*(size_t *)(in_RDI + 0x18));
  }
  iVar1 = *(int *)(in_RDI + 0x20);
  if (iVar1 == 1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)local_10,
               (char *)in_stack_ffffffffffffff08);
    bVar3 = sv((char *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
    local_80 = bVar3._M_len;
    ASTSerializer::write(local_10,local_70,local_68,local_80);
  }
  else if (iVar1 == 2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff10,
               (char *)local_10);
    bVar3 = sv((char *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
    local_a0 = bVar3._M_len;
    ASTSerializer::write(local_10,local_90,local_88,local_a0);
  }
  else if (iVar1 == 3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff10,
               (char *)in_stack_ffffffffffffff08);
    bVar3 = sv((char *)local_10,(size_t)in_stack_fffffffffffffef8);
    local_c0 = bVar3._M_len;
    ASTSerializer::write(local_10,local_b0,local_a8,local_c0);
  }
  return;
}

Assistant:

void CoverageBinSymbol::TransRangeList::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("items");
    for (auto item : items)
        serializer.serialize(*item);
    serializer.endArray();

    if (repeatFrom)
        serializer.write("repeatFrom", *repeatFrom);
    if (repeatTo)
        serializer.write("repeatTo", *repeatTo);

    switch (repeatKind) {
        case Consecutive:
            serializer.write("repeatKind", "Consecutive"sv);
            break;
        case Nonconsecutive:
            serializer.write("repeatKind", "Nonconsecutive"sv);
            break;
        case GoTo:
            serializer.write("repeatKind", "GoTo"sv);
            break;
        default:
            break;
    }
}